

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.h
# Opt level: O2

unsigned_long * __thiscall GF2::Func<4UL,_unsigned_long>::Max(Func<4UL,_unsigned_long> *this)

{
  long lVar1;
  word x;
  long lVar2;
  long lVar3;
  
  lVar3 = 0;
  for (lVar2 = 1; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    lVar1 = lVar2;
    if (this->_vals[lVar2] <= this->_vals[lVar3]) {
      lVar1 = lVar3;
    }
    lVar3 = lVar1;
  }
  return this->_vals + lVar3;
}

Assistant:

const _T& Max() const
	{	
		word xmax = 0;
		for (word x = 1; x < _size; ++x)
			if (_vals[x] > _vals[xmax]) 
				xmax = x;
		return _vals[xmax];
	}